

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

int __thiscall TxOrphanage::EraseTx(TxOrphanage *this,Wtxid *wtxid)

{
  pointer *pp_Var1;
  key_type *pkVar2;
  long lVar3;
  pointer p_Var4;
  pointer p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  bool bVar8;
  int iVar9;
  iterator __position;
  time_point tVar10;
  CTxIn *txin;
  key_type *__k;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  long local_88;
  iterator it;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  it._M_node = (_Base_ptr)
               std::
               _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
               ::find((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                       *)this,wtxid);
  if ((_Rb_tree_header *)it._M_node == &(this->m_orphans)._M_t._M_impl.super__Rb_tree_header) {
    iVar9 = 0;
  }
  else {
    pkVar2 = (key_type *)(*(undefined8 **)(it._M_node + 2))[1];
    for (__k = (key_type *)**(undefined8 **)(it._M_node + 2); __k != pkVar2;
        __k = (key_type *)&__k[2].n) {
      __position = std::
                   _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                   ::find(&(this->m_outpoint_to_orphan_it)._M_t,__k);
      if ((_Rb_tree_header *)__position._M_node !=
          &(this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
        ::erase((_Rb_tree<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                 *)&__position._M_node[2]._M_parent,&it);
        if (__position._M_node[3]._M_left == (_Base_ptr)0x0) {
          std::
          _Rb_tree<COutPoint,std::pair<COutPoint_const,std::set<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,std::_Select1st<std::pair<COutPoint_const,std::set<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::set<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>>>
          ::erase_abi_cxx11_((_Rb_tree<COutPoint,std::pair<COutPoint_const,std::set<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,std::_Select1st<std::pair<COutPoint_const,std::set<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::set<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>>>
                              *)&this->m_outpoint_to_orphan_it,__position);
        }
      }
    }
    lVar3 = *(long *)(it._M_node + 3);
    p_Var4 = (this->m_orphan_list).
             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var4[lVar3]._M_node != it._M_node) {
      __assert_fail("m_orphan_list[old_pos] == it",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
                    ,0x40,"int TxOrphanage::EraseTx(const Wtxid &)");
    }
    p_Var5 = (this->m_orphan_list).
             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (lVar3 + NET != (long)p_Var5 - (long)p_Var4 >> 3) {
      p_Var6 = p_Var5[-1]._M_node;
      p_Var4[lVar3]._M_node = p_Var6;
      *(long *)(p_Var6 + 3) = lVar3;
    }
    lVar7 = *(long *)(it._M_node + 2);
    bVar8 = ::LogAcceptCategory(lVar3 + NET,(Level)p_Var5);
    if (bVar8) {
      base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)(lVar7 + 0x39));
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)wtxid);
      tVar10 = NodeClock::now();
      local_88 = ((long)tVar10.__d.__r + 1200000000000 + (long)it._M_node[2]._M_right * -1000000000)
                 / 1000000000;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "EraseTx";
      logging_function._M_len = 7;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,long>
                (logging_function,source_file,0x4c,TXPACKAGES,Debug,
                 (ConstevalFormatString<3U>)0xcd0560,&local_58,&local_78,&local_88);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
    pp_Var1 = &(this->m_orphan_list).
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + -1;
    std::
    _Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
    ::erase_abi_cxx11_((_Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
                        *)this,(iterator)it._M_node);
    iVar9 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int TxOrphanage::EraseTx(const Wtxid& wtxid)
{
    std::map<Wtxid, OrphanTx>::iterator it = m_orphans.find(wtxid);
    if (it == m_orphans.end())
        return 0;
    for (const CTxIn& txin : it->second.tx->vin)
    {
        auto itPrev = m_outpoint_to_orphan_it.find(txin.prevout);
        if (itPrev == m_outpoint_to_orphan_it.end())
            continue;
        itPrev->second.erase(it);
        if (itPrev->second.empty())
            m_outpoint_to_orphan_it.erase(itPrev);
    }

    size_t old_pos = it->second.list_pos;
    assert(m_orphan_list[old_pos] == it);
    if (old_pos + 1 != m_orphan_list.size()) {
        // Unless we're deleting the last entry in m_orphan_list, move the last
        // entry to the position we're deleting.
        auto it_last = m_orphan_list.back();
        m_orphan_list[old_pos] = it_last;
        it_last->second.list_pos = old_pos;
    }
    const auto& txid = it->second.tx->GetHash();
    // Time spent in orphanage = difference between current and entry time.
    // Entry time is equal to ORPHAN_TX_EXPIRE_TIME earlier than entry's expiry.
    LogDebug(BCLog::TXPACKAGES, "   removed orphan tx %s (wtxid=%s) after %ds\n", txid.ToString(), wtxid.ToString(),
             Ticks<std::chrono::seconds>(NodeClock::now() + ORPHAN_TX_EXPIRE_TIME - it->second.nTimeExpire));
    m_orphan_list.pop_back();

    m_orphans.erase(it);
    return 1;
}